

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

AAmmo * __thiscall AWeapon::AddAmmo(AWeapon *this,AActor *other,PClassActor *ammotype,int amount)

{
  int iVar1;
  int iVar2;
  AAmmo *pAVar3;
  double dVar4;
  DVector3 local_38;
  
  if (ammotype == (PClassActor *)0x0) {
    pAVar3 = (AAmmo *)0x0;
  }
  else {
    if ((deathmatch.Value != 0) && (((undefined1)gameinfo.gametype & GAME_DoomChex) != GAME_Any)) {
      amount = (amount * 5) / 2;
    }
    if (((this->super_AStateProvider).super_AInventory.ItemFlags & 0x4000) == 0) {
      dVar4 = G_SkillProperty(SKILLP_AmmoFactor);
      amount = (int)(dVar4 * (double)amount);
    }
    pAVar3 = (AAmmo *)AActor::FindInventory(other,ammotype,false);
    if (pAVar3 == (AAmmo *)0x0) {
      local_38.X = 0.0;
      local_38.Y = 0.0;
      local_38.Z = 0.0;
      pAVar3 = (AAmmo *)AActor::StaticSpawn(ammotype,&local_38,NO_REPLACE,false);
      iVar2 = (pAVar3->super_AInventory).MaxAmount;
      if (amount < iVar2) {
        iVar2 = amount;
      }
      (pAVar3->super_AInventory).Amount = iVar2;
      (*(pAVar3->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[0x29])
                (pAVar3,other);
    }
    else {
      iVar2 = (pAVar3->super_AInventory).Amount;
      iVar1 = (pAVar3->super_AInventory).MaxAmount;
      if (iVar2 < iVar1) {
        iVar2 = iVar2 + amount;
        if (iVar1 <= iVar2) {
          iVar2 = iVar1;
        }
        (pAVar3->super_AInventory).Amount = iVar2;
      }
    }
  }
  return pAVar3;
}

Assistant:

AAmmo *AWeapon::AddAmmo (AActor *other, PClassActor *ammotype, int amount)
{
	AAmmo *ammo;

	if (ammotype == NULL)
	{
		return NULL;
	}

	// [BC] This behavior is from the original Doom. Give 5/2 times as much ammo when
	// we pick up a weapon in deathmatch.
	if (( deathmatch ) && ( gameinfo.gametype & GAME_DoomChex ))
		amount = amount * 5 / 2;

	// extra ammo in baby mode and nightmare mode
	if (!(this->ItemFlags&IF_IGNORESKILL))
	{
		amount = int(amount * G_SkillProperty(SKILLP_AmmoFactor));
	}
	ammo = static_cast<AAmmo *>(other->FindInventory (ammotype));
	if (ammo == NULL)
	{
		ammo = static_cast<AAmmo *>(Spawn (ammotype));
		ammo->Amount = MIN (amount, ammo->MaxAmount);
		ammo->AttachToOwner (other);
	}
	else if (ammo->Amount < ammo->MaxAmount)
	{
		ammo->Amount += amount;
		if (ammo->Amount > ammo->MaxAmount)
		{
			ammo->Amount = ammo->MaxAmount;
		}
	}
	return ammo;
}